

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O3

void envy_bios_print_power_unk94(envy_bios *bios,FILE *out,uint mask)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = (bios->power).unk94.offset;
  if ((mask >> 10 & 1) == 0 || uVar1 == 0) {
    return;
  }
  uVar2 = (ulong)(bios->power).unk94.version;
  if ((bios->power).unk94.valid != '\0') {
    fprintf((FILE *)out,"THERM MONITOR table at 0x%x, version %x\n",(ulong)uVar1,uVar2);
    envy_bios_dump_hex(bios,out,(bios->power).unk94.offset,(uint)(bios->power).unk94.hlen,mask);
    if ((int)mask < 0) {
      fputc(10,(FILE *)out);
    }
    if ((bios->power).unk94.entriesnum != '\0') {
      uVar2 = 0;
      do {
        envy_bios_dump_hex(bios,out,(bios->power).unk94.entries[uVar2].offset,
                           (uint)(bios->power).unk94.rlen,mask);
        if ((int)mask < 0) {
          fputc(10,(FILE *)out);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < (bios->power).unk94.entriesnum);
    }
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse THERM MONITOR table at 0x%x, version %x\n",(ulong)uVar1,uVar2
         );
  return;
}

Assistant:

void envy_bios_print_power_unk94(struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_power_unk94 *unk94 = &bios->power.unk94;
	int i;

	if (!unk94->offset || !(mask & ENVY_BIOS_PRINT_PERF))
		return;
	if (!unk94->valid) {
		fprintf(out, "Failed to parse THERM MONITOR table at 0x%x, version %x\n", unk94->offset, unk94->version);
		return;
	}

	fprintf(out, "THERM MONITOR table at 0x%x, version %x\n", unk94->offset, unk94->version);
	envy_bios_dump_hex(bios, out, unk94->offset, unk94->hlen, mask);
	if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");

	for (i = 0; i < unk94->entriesnum; i++) {
		envy_bios_dump_hex(bios, out, unk94->entries[i].offset, unk94->rlen, mask);
		if (mask & ENVY_BIOS_PRINT_VERBOSE) fprintf(out, "\n");
	}

	fprintf(out, "\n");
}